

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acknowledge_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Acknowledge_PDU::Encode(Acknowledge_PDU *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Acknowledge_PDU *this_local;
  
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  pKVar1 = KDataStream::operator<<(stream,this->m_ui16AcknowledgeFlag);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16ResponseFlag);
  KDataStream::operator<<(pKVar1,this->m_ui32RequestID);
  return;
}

Assistant:

void Acknowledge_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );
    stream << m_ui16AcknowledgeFlag
           << m_ui16ResponseFlag
           << m_ui32RequestID;
}